

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STValidation.cpp
# Opt level: O2

void __thiscall
jbcoin::STValidation::STValidation(STValidation *this,SerialIter *sit,bool checkSignature)

{
  atomic<int> *paVar1;
  bool bVar2;
  int iVar3;
  Counter *pCVar4;
  undefined1 local_1e0 [24];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  Slice local_1b0;
  undefined1 local_1a0 [392];
  
  getFormat();
  STObject::STObject(&this->super_STObject,&getFormat::holder.format,sit,(SField *)sfValidation);
  pCVar4 = CountedObject<jbcoin::STValidation>::getCounter();
  LOCK();
  paVar1 = &(pCVar4->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STValidation_002f91d0;
  (this->mSeen).__d.__r = 0;
  (this->mNodeID).pn[0] = 0;
  (this->mNodeID).pn[1] = 0;
  (this->mNodeID).pn[2] = 0;
  (this->mNodeID).pn[3] = 0;
  *(undefined8 *)((long)(this->mNodeID).pn + 0xd) = 0;
  STObject::getFieldVL((Blob *)&local_1c8,&this->super_STObject,(SField *)sfSigningPubKey);
  local_1b0.size_ =
       CONCAT44(local_1c8._M_impl.super__Vector_impl_data._M_finish._4_4_,
                (Severity)local_1c8._M_impl.super__Vector_impl_data._M_finish) -
       (long)local_1c8._M_impl.super__Vector_impl_data._M_start;
  local_1b0.data_ = local_1c8._M_impl.super__Vector_impl_data._M_start;
  PublicKey::PublicKey((PublicKey *)local_1a0,&local_1b0);
  calcNodeID((NodeID *)local_1e0,(PublicKey *)local_1a0);
  base_uint<160UL,_jbcoin::detail::NodeIDTag>::operator=
            (&this->mNodeID,(base_uint<160UL,_jbcoin::detail::NodeIDTag> *)local_1e0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
  bVar2 = beast::operator!=(&this->mNodeID);
  if (!bVar2) {
    __assert_fail("mNodeID.isNonZero ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STValidation.cpp"
                  ,0x22,"jbcoin::STValidation::STValidation(SerialIter &, bool)");
  }
  if (checkSignature) {
    bVar2 = isValid(this);
    if (!bVar2) {
      debugLog();
      iVar3 = (*(*(_func_int ***)local_1a0._0_8_)[2])(local_1a0._0_8_,4);
      if ((char)iVar3 != '\0') {
        debugLog();
        local_1c8._M_impl.super__Vector_impl_data._M_start = local_1b0.data_;
        local_1c8._M_impl.super__Vector_impl_data._M_finish._0_4_ = kError;
        beast::Journal::ScopedStream::ScopedStream<char[19]>
                  ((ScopedStream *)local_1a0,(Stream *)&local_1c8,
                   (char (*) [19])"Invalid validation");
        STObject::getJson((STObject *)local_1e0,(int)this);
        Json::operator<<((ostream *)(local_1a0 + 0x10),(Value *)local_1e0);
        Json::Value::~Value((Value *)local_1e0);
        beast::Journal::ScopedStream::~ScopedStream((ScopedStream *)local_1a0);
      }
      Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"Invalid validation");
    }
  }
  return;
}

Assistant:

STValidation::STValidation (SerialIter& sit, bool checkSignature)
    : STObject (getFormat (), sit, sfValidation)
{
    mNodeID = calcNodeID(
        PublicKey(makeSlice (getFieldVL (sfSigningPubKey))));
    assert (mNodeID.isNonZero ());

    if  (checkSignature && !isValid ())
    {
        JLOG (debugLog().error())
            << "Invalid validation" << getJson (0);
        Throw<std::runtime_error> ("Invalid validation");
    }
}